

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deString.c
# Opt level: O0

deInt32 deVsprintf(char *string,size_t size,char *format,__va_list_tag *list)

{
  int iVar1;
  int res;
  __va_list_tag *list_local;
  char *format_local;
  size_t size_local;
  char *string_local;
  
  iVar1 = vsnprintf(string,size,format,list);
  return iVar1;
}

Assistant:

int deVsprintf (char* string, size_t size, const char* format, va_list list)
{
	int			res;

	DE_ASSERT(string && format);

#if (DE_COMPILER == DE_COMPILER_MSC)
#	if (DE_OS == DE_OS_WINCE)
	res = _vsnprintf(string, size, format, list);
#	else
	res = vsnprintf_s(string, size, _TRUNCATE, format, list);
#	endif
#else
	res = vsnprintf(string, size, format, list);
#endif

	return res;
}